

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_verify_info(char *buf,size_t size,char *prefix,uint32_t flags)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char **ppcVar4;
  size_t __maxlen;
  bool bVar5;
  
  __maxlen = size;
  for (ppcVar4 = &x509_crt_verify_strings[0].string; *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 2)
  {
    uVar2 = ((x509_crt_verify_string *)(ppcVar4 + -1))->code;
    if ((uVar2 & flags) != 0) {
      uVar1 = snprintf(buf,__maxlen,"%s%s\n",prefix);
      if ((int)uVar1 < 0) {
        return -0x2980;
      }
      uVar3 = (ulong)uVar1;
      bVar5 = __maxlen < uVar3;
      __maxlen = __maxlen - uVar3;
      if (bVar5 || __maxlen == 0) {
        return -0x2980;
      }
      buf = buf + uVar3;
      flags = flags ^ uVar2;
    }
  }
  if (flags != 0) {
    uVar2 = snprintf(buf,__maxlen,"%sUnknown reason (this should not happen)\n",prefix);
    if ((int)uVar2 < 0) {
      return -0x2980;
    }
    bVar5 = __maxlen < uVar2;
    __maxlen = __maxlen - uVar2;
    if (bVar5 || __maxlen == 0) {
      return -0x2980;
    }
  }
  return (int)size - (int)__maxlen;
}

Assistant:

int mbedtls_x509_crt_verify_info( char *buf, size_t size, const char *prefix,
                          uint32_t flags )
{
    int ret;
    const struct x509_crt_verify_string *cur;
    char *p = buf;
    size_t n = size;

    for( cur = x509_crt_verify_strings; cur->string != NULL ; cur++ )
    {
        if( ( flags & cur->code ) == 0 )
            continue;

        ret = mbedtls_snprintf( p, n, "%s%s\n", prefix, cur->string );
        MBEDTLS_X509_SAFE_SNPRINTF;
        flags ^= cur->code;
    }

    if( flags != 0 )
    {
        ret = mbedtls_snprintf( p, n, "%sUnknown reason "
                                       "(this should not happen)\n", prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }

    return( (int) ( size - n ) );
}